

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int SetFilPos(GmfMshSct *msh,int64_t pos)

{
  int iVar1;
  
  iVar1 = fseek((FILE *)msh->hdl,pos,0);
  return (int)(iVar1 == 0);
}

Assistant:

static int SetFilPos(GmfMshSct *msh, int64_t pos)
{
#ifdef WITH_GMF_AIO
   if(msh->typ & Bin)
      return((lseek(msh->FilDes, (size_t)pos, 0) != -1));
   else
      return((MYFSEEK(msh->hdl, (size_t)pos, SEEK_SET) == 0));
#else
   return((MYFSEEK(msh->hdl, (size_t)pos, SEEK_SET) == 0));
#endif
}